

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O3

void __thiscall xray_re::xr_bone::setup(xr_bone *this,uint16_t id,xr_object *object)

{
  xr_bone *pxVar1;
  xr_bone *local_10;
  
  this->m_id = id;
  if ((this->m_parent_name)._M_string_length != 0) {
    pxVar1 = xr_object::find_bone(object,&this->m_parent_name);
    this->m_parent = pxVar1;
    if (pxVar1 == (xr_bone *)0x0) {
      (this->m_parent_name)._M_string_length = 0;
      *(this->m_parent_name)._M_dataplus._M_p = '\0';
    }
    else {
      local_10 = this;
      std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>::
      emplace_back<xray_re::xr_bone*>
                ((vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>> *)&pxVar1->m_children,
                 &local_10);
    }
  }
  return;
}

Assistant:

void xr_bone::setup(uint16_t id, xr_object& object)
{
	m_id = id;
	if (!m_parent_name.empty()) {
		m_parent = object.find_bone(m_parent_name);
		
		if (m_parent)
			m_parent->m_children.push_back(this);
		else
			m_parent_name.clear();
	}
}